

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack32_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  out[1] = in[1] - base;
  out[2] = in[2] - base;
  out[3] = in[3] - base;
  out[4] = in[4] - base;
  out[5] = in[5] - base;
  out[6] = in[6] - base;
  out[7] = in[7] - base;
  return out + 8;
}

Assistant:

uint32_t * pack32_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++out;
    ++in;

    return out;
}